

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O1

void __thiscall
wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::
doEndBranch(CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
            *this,SpillPointers *self,Expression **currp)

{
  pointer *__args;
  BranchUtils *this_00;
  iterator __position;
  pointer __from;
  vector<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>>
  *this_01;
  _Base_ptr p_Var1;
  BasicBlock *__to;
  Expression ***this_02;
  undefined1 local_88 [8];
  NameSet branchTargets;
  Name target;
  
  this_00 = (BranchUtils *)
            (self->
            super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
            ).super_Pass._vptr_Pass;
  branchTargets._M_t._M_impl._0_4_ = 0;
  branchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  branchTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  branchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  branchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Rb_tree_node_base *)&branchTargets;
  branchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Rb_tree_node_base *)&branchTargets;
  BranchUtils::
  operateOnScopeNameUses<wasm::BranchUtils::getUniqueTargets(wasm::Expression*)::_lambda(wasm::Name&)_1_>
            (this_00,(Expression *)local_88,(anon_class_8_1_ba1d7401)currp);
  if (branchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
      (_Rb_tree_node_base *)&branchTargets) {
    __args = &(this->loopLastBlockStack).
              super__Vector_base<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    p_Var1 = branchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      branchTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = *(size_t *)(p_Var1 + 1);
      this_01 = (vector<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>>
                 *)std::
                   map<wasm::Name,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
                   ::operator[]((map<wasm::Name,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
                                 *)&(this->loopLastBlockStack).
                                    super__Vector_base<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (key_type *)
                                &branchTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      __position._M_current = *(BasicBlock ***)(this_01 + 8);
      if (__position._M_current == *(BasicBlock ***)(this_01 + 0x10)) {
        std::
        vector<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>>
        ::
        _M_realloc_insert<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*const&>
                  (this_01,__position,(BasicBlock **)__args);
      }
      else {
        *__position._M_current = (BasicBlock *)*__args;
        *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while (p_Var1 != (_Rb_tree_node_base *)&branchTargets);
  }
  if (*(long *)(this_00 + 8) == 1) {
    (this->loopLastBlockStack).
    super__Vector_base<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    __from = (this->loopLastBlockStack).
             super__Vector_base<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this_02 = &(this->
               super_PostWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>).
               super_Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.stack.
               fixed._M_elems[4].currp;
    __to = startBasicBlock((CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                            *)this_02);
    link((CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness> *
         )this_02,(char *)__from,(char *)__to);
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)local_88);
  return;
}

Assistant:

static void doEndBranch(SubType* self, Expression** currp) {
    auto* curr = *currp;
    auto branchTargets = BranchUtils::getUniqueTargets(curr);
    // Add branches to the targets.
    for (auto target : branchTargets) {
      self->branches[target].push_back(self->currBasicBlock);
    }
    if (curr->type != Type::unreachable) {
      auto* last = self->currBasicBlock;
      self->link(last, self->startBasicBlock()); // we might fall through
    } else {
      self->startUnreachableBlock();
    }
  }